

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

double r8_max(double x,double y)

{
  if (x <= y) {
    x = y;
  }
  return x;
}

Assistant:

double r8_max ( double x, double y )

/******************************************************************************/
// Unmodified code written by John Burkardt
/*
  Purpose:

    R8_MAX returns the maximum of two R8's.

  Licensing:

    This code is distributed under the GNU LGPL license. 

  Modified:

    18 August 2004

  Author:

    John Burkardt

  Parameters:

    Input, double X, Y, the quantities to compare.

    Output, double R8_MAX, the maximum of X and Y.
*/
{
  double value;

  if ( y < x )
  {
    value = x;
  } 
  else
  {
    value = y;
  }
  return value;
}